

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_supported_point_formats_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  ulong uVar1;
  int line;
  ulong uVar2;
  char *format;
  
  uVar1 = (ulong)*buf;
  if (uVar1 + 1 == len) {
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (buf[uVar2 + 1] < 2) {
          (ssl->handshake->ecdh_ctx).point_format = (uint)buf[uVar2 + 1];
          mbedtls_debug_print_msg
                    (ssl,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x4c8,"point format selected: %d",(ulong)buf[uVar2 + 1]);
          return 0;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    format = "no point format in common";
    line = 0x4d0;
  }
  else {
    format = "bad server hello message";
    line = 0x4b8;
  }
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,line,format);
  return -0x7980;
}

Assistant:

static int ssl_parse_supported_point_formats_ext( mbedtls_ssl_context *ssl,
                                                  const unsigned char *buf,
                                                  size_t len )
{
    size_t list_size;
    const unsigned char *p;

    list_size = buf[0];
    if( list_size + 1 != len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    p = buf + 1;
    while( list_size > 0 )
    {
        if( p[0] == MBEDTLS_ECP_PF_UNCOMPRESSED ||
            p[0] == MBEDTLS_ECP_PF_COMPRESSED )
        {
#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
            ssl->handshake->ecdh_ctx.point_format = p[0];
#endif            
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
            ssl->handshake->ecjpake_ctx.point_format = p[0];
#endif
            MBEDTLS_SSL_DEBUG_MSG( 4, ( "point format selected: %d", p[0] ) );
            return( 0 );
        }

        list_size--;
        p++;
    }

    MBEDTLS_SSL_DEBUG_MSG( 1, ( "no point format in common" ) );
    return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
}